

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SegmentedMap.hpp
# Opt level: O2

mapped_type * __thiscall
binlog::detail::SegmentedMap<binlog::EventSource>::find
          (SegmentedMap<binlog::EventSource> *this,key_type *key)

{
  pointer pvVar1;
  long lVar2;
  key_type kVar3;
  mapped_type *pmVar4;
  ulong uVar5;
  
  kVar3 = segmentIndex(this,*key);
  pvVar1 = (this->_segments).
           super__Vector_base<std::vector<binlog::EventSource,_std::allocator<binlog::EventSource>_>,_std::allocator<std::vector<binlog::EventSource,_std::allocator<binlog::EventSource>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar5 = *key - (this->_offsets).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start[kVar3];
  lVar2 = *(long *)&pvVar1[kVar3].
                    super__Vector_base<binlog::EventSource,_std::allocator<binlog::EventSource>_>.
                    _M_impl.super__Vector_impl_data;
  pmVar4 = (mapped_type *)0x0;
  if (uVar5 < (ulong)(((long)*(pointer *)
                              ((long)&pvVar1[kVar3].
                                      super__Vector_base<binlog::EventSource,_std::allocator<binlog::EventSource>_>
                                      ._M_impl.super__Vector_impl_data + 8) - lVar2) / 0xb8)) {
    pmVar4 = (mapped_type *)(uVar5 * 0xb8 + lVar2);
  }
  return pmVar4;
}

Assistant:

const mapped_type* find(const key_type& key) const
  {
    const key_type si = segmentIndex(key);
    const key_type offset = _offsets[si];
    const key_type vi = key - offset;
    const Segment& segment = _segments[si];

    if (vi < segment.size())
    {
      return & segment[vi];
    }

    return end();
  }